

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

void __thiscall QTabBarPrivate::slide(QTabBarPrivate *this,int from,int to)

{
  int *piVar1;
  Shape SVar2;
  ulong uVar3;
  QWidget *this_00;
  Tab *this_01;
  Representation RVar4;
  Representation RVar5;
  bool bVar6;
  QRect QVar7;
  QRect QVar8;
  Representation local_40;
  
  if (((-1 < from && from != to) && (uVar3 = (this->tabList).d.size, -1 < to && (uint)from < uVar3))
     && ((uint)to < uVar3)) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    SVar2 = this->shape;
    QVar7 = QTabBar::tabRect((QTabBar *)this_00,from);
    QWidget::setUpdatesEnabled(this_00,false);
    QTabBar::moveTab((QTabBar *)this_00,from,to);
    QWidget::setUpdatesEnabled(this_00,true);
    QVar8 = QTabBar::tabRect((QTabBar *)this_00,to);
    bVar6 = (SVar2 - RoundedWest & 0xfffffffa) != 0;
    local_40 = QVar7.x1.m_i;
    RVar5.m_i = QVar7.y1.m_i.m_i;
    if (bVar6) {
      RVar5.m_i = local_40.m_i;
    }
    RVar4.m_i = QVar8.y1.m_i.m_i;
    if (bVar6) {
      RVar4.m_i = QVar8.x1.m_i.m_i;
    }
    this_01 = (this->tabList).d.ptr[(uint)to];
    piVar1 = &this_01->dragOffset;
    *piVar1 = *piVar1 + (RVar5.m_i - RVar4.m_i);
    Tab::startAnimation(this_01,this,0xfa);
    return;
  }
  return;
}

Assistant:

void QTabBarPrivate::slide(int from, int to)
{
    Q_Q(QTabBar);
    if (from == to
            || !validIndex(from)
            || !validIndex(to))
        return;
    bool vertical = verticalTabs(shape);
    int preLocation = vertical ? q->tabRect(from).y() : q->tabRect(from).x();
    q->setUpdatesEnabled(false);
    q->moveTab(from, to);
    q->setUpdatesEnabled(true);
    int postLocation = vertical ? q->tabRect(to).y() : q->tabRect(to).x();
    int length = postLocation - preLocation;
    tabList.at(to)->dragOffset -= length;
    tabList.at(to)->startAnimation(this, ANIMATION_DURATION);
}